

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping_padding.cpp
# Opt level: O3

void test_2d_dynamic<5ul,1ul,1ul,1ul,30ul,30ul>(void)

{
  undefined8 uVar1;
  int *t;
  long lVar2;
  long lVar3;
  int *piVar4;
  char *pcVar5;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  int *local_98;
  long local_90;
  int *local_88;
  int *local_80;
  vector<int,_std::allocator<int>_> local_78;
  int *local_60;
  int *local_58;
  int *local_50;
  long local_48;
  int *local_40;
  long local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_80 = (int *)CONCAT71(local_80._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xaf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_78,(bool *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_80._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb1,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_78,(int *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_80 = (int *)CONCAT44(local_80._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_78,(int *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  local_80 = (int *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb4,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_78,(unsigned_long *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003c1;
  local_80 = (int *)0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb5,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_78,(unsigned_long *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_80 = (int *)CONCAT71(local_80._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xbd,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_78,(bool *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5;
  local_80 = (int *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xbf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_78,(unsigned_long *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_80 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc0,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_78,(unsigned_long *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xb4;
  local_80 = (int *)0xb4;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_78,(unsigned_long *)&local_80);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003c1;
  local_80 = (int *)0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc3,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_78,(unsigned_long *)&local_80);
  local_80 = (int *)CONCAT44(local_80._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_78,0x3c1,(value_type_conflict1 *)&local_80,(allocator_type *)&local_98);
  local_88 = (int *)0x0;
  local_58 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_90 = 0;
  do {
    lVar2 = 0;
    local_60 = local_88;
    while( true ) {
      t = (int *)(local_90 + lVar2);
      local_98 = t;
      local_80 = t;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xd1,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_98,(unsigned_long *)&local_80);
      piVar4 = (int *)((long)local_58 + (long)local_88);
      local_50 = local_58 + (long)local_80;
      local_98 = piVar4;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xd3,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_98,&local_50);
      if (lVar2 == 0x3a2) break;
      if (local_90 == 0x1e) {
        *piVar4 = 0x18;
        local_98._0_4_ = 0x18;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0xe5,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar4,(int *)&local_98);
        if ((int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= t) goto LAB_0010a511;
        local_98 = (int *)CONCAT44(local_98._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0xe8,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + (long)local_88),
                   (int *)&local_98);
      }
      lVar2 = lVar2 + 0x1f;
      local_88 = local_88 + 0x1f;
    }
    *(undefined4 *)((long)local_58 + (long)local_88) = 0x11;
    local_98._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0xda,
               "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,piVar4,(int *)&local_98);
    if ((int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= t) goto LAB_0010a511;
    local_98 = (int *)CONCAT44(local_98._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i, j)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0xdd,
               "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + (long)local_88),(int *)&local_98);
    local_90 = local_90 + 1;
    local_88 = local_60 + 1;
  } while (local_90 != 0x1f);
  piVar4 = (int *)0x0;
  pcVar5 = 
  "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]";
  local_90 = 0;
  do {
    lVar2 = 0;
    local_60 = piVar4;
    do {
      local_98 = (int *)(local_90 + lVar2);
      local_88 = local_98;
      local_80 = local_98;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xf4,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_98,(unsigned_long *)&local_80);
      t = (int *)((long)local_58 + (long)piVar4);
      local_50 = local_58 + (long)local_80;
      local_98 = t;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xf6,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_98,&local_50);
      *t = 0x47;
      local_98._0_4_ = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xfa,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,t,(int *)&local_98);
      if ((int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= local_88) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_0010a500;
      }
      local_98 = (int *)CONCAT44(local_98._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xfd,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)piVar4),(int *)&local_98);
      lVar2 = lVar2 + 0x9b;
      piVar4 = piVar4 + 0x9b;
    } while (lVar2 != 0x3a2);
    local_90 = local_90 + 1;
    piVar4 = local_60 + 1;
  } while (local_90 != 0x1e);
  local_48 = 0;
  local_60 = local_58;
  lVar2 = 0;
  pcVar5 = (char *)0x0;
  while( true ) {
    lVar3 = 0;
    local_88 = (int *)0x0;
    local_90 = 0;
    local_40 = (int *)pcVar5;
    local_38 = lVar2;
    while( true ) {
      local_98 = (int *)pcVar5;
      local_80 = (int *)pcVar5;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x106,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_98,(unsigned_long *)&local_80);
      t = (int *)((long)local_60 + lVar3);
      local_50 = local_58 + (long)local_80;
      local_98 = t;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x108,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_98,&local_50);
      if (lVar3 == 0xe88) break;
      if (local_40 == (int *)0x1e) {
        local_98._0_4_ = 0x18;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x116,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,t,(int *)&local_98);
        if ((int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= pcVar5) goto LAB_0010a500;
        local_98 = (int *)CONCAT44(local_98._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x119,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar3 + local_48),
                   (int *)&local_98);
      }
      else if ((byte)(((byte)local_88 / 5) * '\x05' + (char)local_90) == '\0') {
        local_98._0_4_ = 0x47;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x124,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,t,(int *)&local_98);
        if ((int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= pcVar5) goto LAB_0010a500;
        local_98 = (int *)CONCAT44(local_98._4_4_,0x47);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x127,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar3 + local_48),
                   (int *)&local_98);
      }
      else {
        local_98._0_4_ = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,300,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,t,(int *)&local_98);
        if ((int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= pcVar5) goto LAB_0010a500;
        local_98 = (int *)CONCAT44(local_98._4_4_,0x2a);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x12f,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar3 + local_48),
                   (int *)&local_98);
      }
      local_90 = CONCAT71((int7)((ulong)local_90 >> 8),(char)local_90 + -1);
      local_88 = (int *)CONCAT71((int7)((ulong)local_88 >> 8),(char)local_88 + '\x01');
      lVar3 = lVar3 + 0x7c;
      pcVar5 = (char *)((long)pcVar5 + 0x1f);
    }
    local_98._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0x10d,
               "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,t,(int *)&local_98);
    lVar2 = local_38;
    if ((int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= pcVar5) break;
    local_98 = (int *)CONCAT44(local_98._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i, j)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0x110,
               "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + (0xe88 - local_38)),
               (int *)&local_98);
    pcVar5 = (char *)((long)local_40 + 1);
    lVar2 = lVar2 + -4;
    local_60 = local_60 + 1;
    local_48 = local_48 + 4;
    if ((int *)pcVar5 == (int *)0x1f) {
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  }
LAB_0010a500:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pcVar5);
LAB_0010a511:
  uVar1 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",t);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const l{{X, Y}, {1, 1}, {PadX, PadY}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_right<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const sub_l{{X / StepX, Y / StepY}, {StepX, StepY}, {PadX, PadY}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.padding()[0]) * (l[1] + l.padding()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.padding();
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1] + p[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.stepping()[0]))
               && (0 == (j % sub_l.stepping()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
            }
        }
    }
}